

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall backend::codegen::Codegen::translate_branch(Codegen *this,JumpInstruction *j)

{
  string_view function_name;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  ConditionCode *pCVar4;
  undefined8 *puVar5;
  exception *this_00;
  uint32_t label_id;
  long in_RSI;
  long *in_RDI;
  Arith2Inst *b2m;
  Arith2Inst *b1m;
  pointer b2;
  pointer b1;
  optional<arm::ConditionCode> cond;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  back;
  undefined4 in_stack_fffffffffffffbe8;
  Reg in_stack_fffffffffffffbec;
  Operand2 *in_stack_fffffffffffffbf0;
  ulong uVar6;
  Operand2 *in_stack_fffffffffffffbf8;
  optional<backend::codegen::LastJump> *in_stack_fffffffffffffc00;
  VarId *in_stack_fffffffffffffc08;
  Codegen *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  Operand2 *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  OpCode *in_stack_fffffffffffffc58;
  long local_318;
  long local_308;
  string local_2c0 [36];
  undefined4 local_29c;
  Reg local_268;
  undefined4 local_264;
  size_type in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  string_view in_stack_fffffffffffffdc0;
  string local_1f0 [36];
  undefined4 local_1cc;
  Reg local_188;
  undefined4 local_184;
  undefined1 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined1 local_160 [16];
  string local_150 [36];
  undefined4 local_12c;
  ConditionCode local_111;
  undefined1 local_110 [16];
  string local_100 [36];
  undefined4 local_dc;
  ConditionCode local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  _Optional_payload_base<arm::ConditionCode> local_ba;
  undefined4 local_b8;
  undefined4 local_b4;
  long local_b0;
  long local_a8;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_a0;
  pointer local_98;
  pointer local_90;
  _Optional_payload_base<arm::ConditionCode> local_82;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_80;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_78 [3];
  undefined1 local_60 [16];
  string local_50 [36];
  undefined4 local_2c;
  long local_10;
  
  *(undefined4 *)((long)in_RDI + 0x1ec) = *(undefined4 *)((long)in_RDI + 0x1fc);
  *(int *)(in_RDI + 0x3e) = (int)in_RDI[0x40];
  *(undefined4 *)((long)in_RDI + 500) = *(undefined4 *)((long)in_RDI + 0x204);
  *(int *)(in_RDI + 0x3f) = (int)in_RDI[0x41];
  local_10 = in_RSI;
  std::optional<backend::codegen::LastJump>::operator=
            ((optional<backend::codegen::LastJump> *)((long)in_RDI + 0x1fc));
  switch(*(undefined4 *)(local_10 + 8)) {
  case 0:
    uVar6 = 8;
    puVar5 = (undefined8 *)__cxa_allocate_exception();
    this_00 = (exception *)operator_new(uVar6);
    std::exception::exception(this_00);
    *puVar5 = this_00;
    __cxa_throw(puVar5,&std::exception*::typeinfo,0);
  case 1:
    bVar2 = std::optional<mir::inst::VarId>::has_value((optional<mir::inst::VarId> *)0x214007);
    if (bVar2) {
      local_264 = 6;
      local_268 = arm::make_register(GeneralPurpose,0);
      std::optional<mir::inst::VarId>::value
                ((optional<mir::inst::VarId> *)in_stack_fffffffffffffbf0);
      mir::inst::VarId::VarId
                ((VarId *)in_stack_fffffffffffffbf0,
                 (VarId *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      translate_var_reg(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      arm::RegisterOperand::RegisterOperand
                ((RegisterOperand *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::RegisterOperand>
                (in_stack_fffffffffffffc58,(uint *)in_stack_fffffffffffffc50,
                 (RegisterOperand *)in_stack_fffffffffffffc48);
      in_stack_fffffffffffffc40 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffda8;
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                 ,(unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
                  in_stack_fffffffffffffbf8);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffbf0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                );
      std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
                 in_stack_fffffffffffffbf0);
    }
    local_29c = 1;
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)(*in_RDI + 8));
    function_name._M_str._0_4_ = in_stack_fffffffffffffdb8;
    function_name._M_len = in_stack_fffffffffffffdb0;
    function_name._M_str._4_4_ = in_stack_fffffffffffffdbc;
    format_fn_end_label_abi_cxx11_(function_name);
    std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string>
              ((OpCode *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::BrInst,std::default_delete<arm::BrInst>,void>
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00,
               (unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
               in_stack_fffffffffffffbf8);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffffbf0,
                (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00);
    std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
              ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
               in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string(local_2c0);
    break;
  case 2:
    local_80 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
               std::
               vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    local_78[0] = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                  ::operator-((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffbf8,
                              (difference_type)in_stack_fffffffffffffbf0);
    std::optional<arm::ConditionCode>::optional((optional<arm::ConditionCode> *)&local_82);
    sVar3 = std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::size((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    *)(in_RDI + 3));
    if (1 < sVar3) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
      ::operator->(local_78);
      local_90 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::get
                           ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                            in_stack_fffffffffffffbf0);
      local_a0 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                 ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                              *)in_stack_fffffffffffffbf8,(difference_type)in_stack_fffffffffffffbf0
                            );
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
      ::operator->(&local_a0);
      local_98 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::get
                           ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                            in_stack_fffffffffffffbf0);
      if ((local_90->op == Mov) && (local_98->op == Mov)) {
        if (local_90 == (pointer)0x0) {
          local_308 = 0;
        }
        else {
          local_308 = __dynamic_cast(local_90,&arm::Inst::typeinfo,&arm::Arith2Inst::typeinfo,0);
        }
        local_a8 = local_308;
        if (local_98 == (pointer)0x0) {
          local_318 = 0;
        }
        else {
          local_318 = __dynamic_cast(local_98,&arm::Inst::typeinfo,&arm::Arith2Inst::typeinfo,0);
        }
        local_b0 = local_318;
        bVar2 = false;
        if (*(int *)(local_a8 + 0x10) == *(int *)(local_318 + 0x10)) {
          local_b4 = 0;
          bVar1 = arm::Operand2::operator==
                            (in_stack_fffffffffffffbf8,(int32_t *)in_stack_fffffffffffffbf0);
          bVar2 = false;
          if (bVar1) {
            local_b8 = 1;
            bVar1 = arm::Operand2::operator==
                              (in_stack_fffffffffffffbf8,(int32_t *)in_stack_fffffffffffffbf0);
            bVar2 = false;
            if ((bVar1) && (bVar2 = false, *(char *)(local_a8 + 0xc) == '\x10')) {
              bVar2 = *(char *)(local_b0 + 0xc) != '\x10';
            }
          }
        }
        if (bVar2) {
          std::optional<arm::ConditionCode>::optional<arm::ConditionCode_&,_true>
                    ((optional<arm::ConditionCode> *)in_stack_fffffffffffffbf0,
                     (ConditionCode *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8))
          ;
          local_82 = local_ba;
        }
      }
    }
    bVar2 = std::optional::operator_cast_to_bool((optional<arm::ConditionCode> *)0x2138ca);
    if (bVar2) {
      pCVar4 = std::optional<arm::ConditionCode>::value
                         ((optional<arm::ConditionCode> *)in_stack_fffffffffffffbf0);
      local_c8 = *pCVar4;
      local_c4 = *(undefined4 *)(local_10 + 0x28);
      local_c0 = *(undefined4 *)(local_10 + 0x2c);
      std::optional<backend::codegen::LastJump>::operator=
                (in_stack_fffffffffffffc00,(LastJump *)in_stack_fffffffffffffbf8);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::pop_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  *)0x21394a);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::pop_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  *)0x213957);
      local_dc = 1;
      local_110 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(*in_RDI + 8));
      format_bb_label_abi_cxx11_(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      pCVar4 = std::optional<arm::ConditionCode>::value
                         ((optional<arm::ConditionCode> *)in_stack_fffffffffffffbf0);
      local_111 = arm::invert_cond(*pCVar4);
      std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string,arm::ConditionCode>
                (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                 (ConditionCode *)in_stack_fffffffffffffc48);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::BrInst,std::default_delete<arm::BrInst>,void>
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                 ,(unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
                  in_stack_fffffffffffffbf8);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffbf0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                );
      std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
                ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
                 in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string(local_100);
      local_12c = 1;
      local_160 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(*in_RDI + 8));
      format_bb_label_abi_cxx11_(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string>
                ((OpCode *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::BrInst,std::default_delete<arm::BrInst>,void>
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                 ,(unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
                  in_stack_fffffffffffffbf8);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffbf0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                );
      std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
                ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
                 in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string(local_150);
    }
    else {
      local_16c = 1;
      local_168 = *(undefined4 *)(local_10 + 0x28);
      local_164 = *(undefined4 *)(local_10 + 0x2c);
      std::optional<backend::codegen::LastJump>::operator=
                (in_stack_fffffffffffffc00,(LastJump *)in_stack_fffffffffffffbf8);
      local_184 = 0x18;
      std::optional<mir::inst::VarId>::value
                ((optional<mir::inst::VarId> *)in_stack_fffffffffffffbf0);
      mir::inst::VarId::VarId
                ((VarId *)in_stack_fffffffffffffbf0,
                 (VarId *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      local_188 = translate_var_reg(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      arm::Operand2::Operand2(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2>
                (in_stack_fffffffffffffc58,(uint *)in_stack_fffffffffffffc50,
                 in_stack_fffffffffffffc48);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                 ,(unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
                  in_stack_fffffffffffffbf8);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffbf0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                );
      std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
                ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
                 in_stack_fffffffffffffbf0);
      local_1cc = 1;
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)(*in_RDI + 8));
      format_bb_label_abi_cxx11_(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string,arm::ConditionCode>
                (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                 (ConditionCode *)in_stack_fffffffffffffc48);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::BrInst,std::default_delete<arm::BrInst>,void>
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                 ,(unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
                  in_stack_fffffffffffffbf8);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffbf0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                );
      std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
                ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
                 in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)(*in_RDI + 8));
      format_bb_label_abi_cxx11_(in_stack_fffffffffffffdc0,label_id);
      std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string>
                ((OpCode *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
      unique_ptr<arm::BrInst,std::default_delete<arm::BrInst>,void>
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                 ,(unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
                  in_stack_fffffffffffffbf8);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffbf0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
      std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00
                );
      std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
                ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
                 in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
    }
    break;
  case 3:
    local_2c = 1;
    local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(*in_RDI + 8));
    format_bb_label_abi_cxx11_(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
    std::make_unique<arm::BrInst,arm::OpCode,std::__cxx11::string>
              ((OpCode *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::BrInst,std::default_delete<arm::BrInst>,void>
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00,
               (unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
               in_stack_fffffffffffffbf8);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffffbf0,
                (value_type *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)in_stack_fffffffffffffc00);
    std::unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_>::~unique_ptr
              ((unique_ptr<arm::BrInst,_std::default_delete<arm::BrInst>_> *)
               in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string(local_50);
    break;
  case 4:
  }
  return;
}

Assistant:

void Codegen::translate_branch(mir::inst::JumpInstruction& j) {
  last_jump = std::move(this_jump);
  this_jump = std::nullopt;
  switch (j.kind) {
    case mir::inst::JumpInstructionKind::Br:
      inst.push_back(std::make_unique<BrInst>(
          OpCode::B, format_bb_label(func.name, j.bb_true)));
      break;
    case mir::inst::JumpInstructionKind::BrCond: {
      auto back = inst.end() - 2;

      // Find if a comparison exists
      std::optional<ConditionCode> cond = std::nullopt;
      if (inst.size() >= 2) {
        auto b1 = back->get();
        auto b2 = (back + 1)->get();
        if (b1->op == arm::OpCode::Mov && b2->op == arm::OpCode::Mov) {
          auto b1m = dynamic_cast<Arith2Inst*>(b1);
          auto b2m = dynamic_cast<Arith2Inst*>(b2);
          if (b1m->r1 == b2m->r1 && b1m->r2 == 0 && b2m->r2 == 1 &&
              b1m->cond == arm::ConditionCode::Always &&
              b2m->cond != arm::ConditionCode::Always) {
            cond = {b2m->cond};
          }
        }
      }
      if (cond) {
        this_jump = LastJump{cond.value(), j.bb_true, j.bb_false};
        inst.pop_back();
        inst.pop_back();
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_false),
            invert_cond(cond.value())));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_true)));
      } else {
        this_jump = LastJump{ConditionCode::NotEqual, j.bb_true, j.bb_false};
        inst.push_back(std::make_unique<Arith2Inst>(
            OpCode::Cmp, translate_var_reg(j.cond_or_ret.value()),
            Operand2(0)));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_false),
            ConditionCode::Equal));
        inst.push_back(std::make_unique<BrInst>(
            OpCode::B, format_bb_label(func.name, j.bb_true)));
      }
    } break;
    case mir::inst::JumpInstructionKind::Return:
      if (j.cond_or_ret.has_value()) {
        // Move return value to its register
        // if (j.cond_or_ret.value().id != 0) {
        inst.push_back(std::make_unique<Arith2Inst>(
            OpCode::Mov, make_register(arm::RegisterKind::GeneralPurpose, 0),
            RegisterOperand(translate_var_reg(j.cond_or_ret.value()))));
        // }
      }
      inst.push_back(
          std::make_unique<BrInst>(OpCode::B, format_fn_end_label(func.name)));
      // Jumps to function end, the rest is cleanup generation in function
      // `generate_return_and_cleanup`
      break;
    case mir::inst::JumpInstructionKind::Undefined:
      // WARN: Error about undefined blocks
      throw new std::exception();
      break;
    case mir::inst::JumpInstructionKind::Unreachable:
      // TODO: Discard unreachable blocks beforhand
      break;
  }
}